

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

string * Kraken::build_query(string *__return_storage_ptr__,KInput *input)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  for (p_Var2 = (input->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(input->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2 != (input->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::operator<<((ostream *)&oss,'&');
    }
    poVar1 = std::operator<<((ostream *)&oss,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,'=');
    std::operator<<(poVar1,(string *)(p_Var2 + 2));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

static std::string build_query(const KInput& input)
{
   std::ostringstream oss;
   KInput::const_iterator it = input.begin();
   for (; it != input.end(); ++it) {
      if (it != input.begin()) oss << '&';  // delimiter
      oss << it->first <<'='<< it->second;
   }

   return oss.str();
}